

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printAddrMode7Operand(MCInst *MI,uint OpNum,SStream *O)

{
  cs_struct *h;
  cs_detail *pcVar1;
  uint uVar2;
  MCOperand *op;
  
  op = MCInst_getOperand(MI,OpNum);
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  h = MI->csh;
  uVar2 = MCOperand_getReg(op);
  printRegName(h,O,uVar2);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar2 = MCOperand_getReg(op);
    pcVar1 = MI->flat_insn->detail;
    *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).arm.op_count * 0x28 + 0x46) = uVar2;
  }
  SStream_concat0(O,"]");
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printAddrMode7Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}